

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

string * cmake::FindCacheFile(string *__return_storage_ptr__,string *binaryDir)

{
  bool bVar1;
  string cachePathFound;
  string cmakeFiles;
  string cacheFile;
  allocator<char> local_b2;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)binaryDir);
  cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_50,(string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)&local_50);
  bVar1 = cmsys::SystemTools::FileExists(&local_50);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_70,(string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)&local_70);
    bVar1 = cmsys::SystemTools::FileExists(&local_70);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMakeCache.txt",&local_b1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/",&local_b2);
      cmSystemTools::FileExistsInParentDirectories
                (&local_90,&local_b0,__return_storage_ptr__,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_b0);
      if (local_90._M_string_length != 0) {
        cmsys::SystemTools::GetFilenamePath(&local_b0,&local_90);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::FindCacheFile(const std::string& binaryDir)
{
  std::string cachePath = binaryDir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  std::string cacheFile = cachePath;
  cacheFile += "/CMakeCache.txt";
  if (!cmSystemTools::FileExists(cacheFile)) {
    // search in parent directories for cache
    std::string cmakeFiles = cachePath;
    cmakeFiles += "/CMakeFiles";
    if (cmSystemTools::FileExists(cmakeFiles)) {
      std::string cachePathFound =
        cmSystemTools::FileExistsInParentDirectories("CMakeCache.txt",
                                                     cachePath, "/");
      if (!cachePathFound.empty()) {
        cachePath = cmSystemTools::GetFilenamePath(cachePathFound);
      }
    }
  }
  return cachePath;
}